

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_connection.c
# Opt level: O0

size_t consume_data(amqp_connection_state_t state,amqp_bytes_t *received_data)

{
  void *pvVar1;
  ulong *in_RSI;
  long in_RDI;
  size_t bytes_consumed;
  size_t local_18;
  
  local_18 = *(long *)(in_RDI + 0xc0) - *(long *)(in_RDI + 0xb8);
  if (*in_RSI < local_18) {
    local_18 = *in_RSI;
  }
  pvVar1 = amqp_offset(*(void **)(in_RDI + 0xb0),*(size_t *)(in_RDI + 0xb8));
  memcpy(pvVar1,(void *)in_RSI[1],local_18);
  *(size_t *)(in_RDI + 0xb8) = local_18 + *(long *)(in_RDI + 0xb8);
  pvVar1 = amqp_offset((void *)in_RSI[1],local_18);
  in_RSI[1] = (ulong)pvVar1;
  *in_RSI = *in_RSI - local_18;
  return local_18;
}

Assistant:

static size_t consume_data(amqp_connection_state_t state,
                           amqp_bytes_t *received_data) {
  /* how much data is available and will fit? */
  size_t bytes_consumed = state->target_size - state->inbound_offset;
  if (received_data->len < bytes_consumed) {
    bytes_consumed = received_data->len;
  }

  memcpy(amqp_offset(state->inbound_buffer.bytes, state->inbound_offset),
         received_data->bytes, bytes_consumed);
  state->inbound_offset += bytes_consumed;
  received_data->bytes = amqp_offset(received_data->bytes, bytes_consumed);
  received_data->len -= bytes_consumed;

  return bytes_consumed;
}